

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void renameQuotefixFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  ushort uVar1;
  sqlite3 *db;
  sqlite3_xauth p_Var2;
  Select *p;
  ExprList *pEVar3;
  Expr *pExpr;
  RenameToken *pRVar4;
  RenameToken *p_00;
  int errCode;
  char *zDb;
  char *zSql;
  Table *pTVar5;
  long lVar6;
  long lVar7;
  long in_FS_OFFSET;
  Parse sParse;
  Walker local_238;
  RenameCtx local_208;
  Parse local_1e0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  db = context->pOut->db;
  zDb = (char *)sqlite3ValueText(*argv,'\x01');
  zSql = (char *)sqlite3ValueText(argv[1],'\x01');
  p_Var2 = db->xAuth;
  db->xAuth = (sqlite3_xauth)0x0;
  if (db->noSharedCache == '\0') {
    btreeEnterAll(db);
  }
  if (zSql == (char *)0x0 || zDb == (char *)0x0) goto LAB_001b2a5f;
  memset(&local_1e0,0xaa,0x1a8);
  errCode = renameParseSql(&local_1e0,zDb,db,zSql,0);
  if (errCode == 0) {
    local_238.u.pNC = (NameContext *)&local_208;
    local_208.pList = (RenameToken *)0x0;
    local_208.nList = 0;
    local_208.iCol = 0;
    local_208.pTab = (Table *)0x0;
    local_208.zOld = (char *)0x0;
    local_238.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
    local_238.walkerDepth = 0;
    local_238.eCode = 0;
    local_238.mWFlags = 0;
    local_238.xExprCallback = renameQuotefixExprCb;
    local_238.xSelectCallback = renameColumnSelectCb;
    local_238.pParse = &local_1e0;
    if (local_1e0.pNewTable == (Table *)0x0) {
      if (local_1e0.pNewIndex == (Index *)0x0) {
        errCode = renameResolveTrigger(&local_1e0);
        p_00 = local_208.pList;
        if (errCode != 0) goto joined_r0x001b2a09;
        renameWalkTrigger(&local_238,local_1e0.pNewTrigger);
      }
      else {
        sqlite3WalkExprList(&local_238,(local_1e0.pNewIndex)->aColExpr);
        if ((local_1e0.pNewIndex)->pPartIdxWhere != (Expr *)0x0) {
          sqlite3WalkExprNN(&local_238,(local_1e0.pNewIndex)->pPartIdxWhere);
        }
      }
LAB_001b29e9:
      errCode = renameEditSql(context,&local_208,zSql,(char *)0x0,0);
      p_00 = local_208.pList;
    }
    else {
      if ((local_1e0.pNewTable)->eTabType != '\x02') {
        sqlite3WalkExprList(&local_238,(local_1e0.pNewTable)->pCheck);
        if (0 < (local_1e0.pNewTable)->nCol) {
          lVar7 = 0xc;
          lVar6 = 0;
          pTVar5 = local_1e0.pNewTable;
          do {
            uVar1 = *(ushort *)((long)&pTVar5->aCol->zCnName + lVar7);
            if ((((uVar1 != 0) && (pTVar5->eTabType == '\0')) &&
                (pEVar3 = (pTVar5->u).tab.pDfltList, pEVar3 != (ExprList *)0x0)) &&
               (((int)(uint)uVar1 <= pEVar3->nExpr &&
                (pExpr = pEVar3->a[uVar1 - 1].pExpr, pExpr != (Expr *)0x0)))) {
              sqlite3WalkExprNN(&local_238,pExpr);
              pTVar5 = local_1e0.pNewTable;
            }
            lVar6 = lVar6 + 1;
            lVar7 = lVar7 + 0x10;
          } while (lVar6 < pTVar5->nCol);
        }
        goto LAB_001b29e9;
      }
      p = *(Select **)&(local_1e0.pNewTable)->u;
      p->selFlags = p->selFlags & 0xffdfffff;
      local_1e0.rc = 0;
      sqlite3SelectPrep(&local_1e0,p,(NameContext *)0x0);
      errCode = 7;
      if (db->mallocFailed == '\0') {
        errCode = local_1e0.rc;
      }
      p_00 = local_208.pList;
      if (errCode == 0) {
        sqlite3WalkSelect(&local_238,p);
        goto LAB_001b29e9;
      }
    }
joined_r0x001b2a09:
    while (p_00 != (RenameToken *)0x0) {
      pRVar4 = p_00->pNext;
      sqlite3DbFreeNN(db,p_00);
      p_00 = pRVar4;
    }
    if (errCode != 0) goto LAB_001b2a23;
  }
  else {
LAB_001b2a23:
    if ((errCode == 1) && (((uint)db->flags & 0x10000001) == 1)) {
      sqlite3_result_value(context,argv[1]);
    }
    else {
      sqlite3_result_error_code(context,errCode);
    }
  }
  renameParseCleanup(&local_1e0);
LAB_001b2a5f:
  db->xAuth = p_Var2;
  if (db->noSharedCache == '\0') {
    btreeLeaveAll(db);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void renameQuotefixFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  char const *zDb = (const char*)sqlite3_value_text(argv[0]);
  char const *zInput = (const char*)sqlite3_value_text(argv[1]);

#ifndef SQLITE_OMIT_AUTHORIZATION
  sqlite3_xauth xAuth = db->xAuth;
  db->xAuth = 0;
#endif

  sqlite3BtreeEnterAll(db);

  UNUSED_PARAMETER(NotUsed);
  if( zDb && zInput ){
    int rc;
    Parse sParse;
    rc = renameParseSql(&sParse, zDb, db, zInput, 0);

    if( rc==SQLITE_OK ){
      RenameCtx sCtx;
      Walker sWalker;

      /* Walker to find tokens that need to be replaced. */
      memset(&sCtx, 0, sizeof(RenameCtx));
      memset(&sWalker, 0, sizeof(Walker));
      sWalker.pParse = &sParse;
      sWalker.xExprCallback = renameQuotefixExprCb;
      sWalker.xSelectCallback = renameColumnSelectCb;
      sWalker.u.pRename = &sCtx;

      if( sParse.pNewTable ){
        if( IsView(sParse.pNewTable) ){
          Select *pSelect = sParse.pNewTable->u.view.pSelect;
          pSelect->selFlags &= ~SF_View;
          sParse.rc = SQLITE_OK;
          sqlite3SelectPrep(&sParse, pSelect, 0);
          rc = (db->mallocFailed ? SQLITE_NOMEM : sParse.rc);
          if( rc==SQLITE_OK ){
            sqlite3WalkSelect(&sWalker, pSelect);
          }
        }else{
          int i;
          sqlite3WalkExprList(&sWalker, sParse.pNewTable->pCheck);
#ifndef SQLITE_OMIT_GENERATED_COLUMNS
          for(i=0; i<sParse.pNewTable->nCol; i++){
            sqlite3WalkExpr(&sWalker,
               sqlite3ColumnExpr(sParse.pNewTable,
                                         &sParse.pNewTable->aCol[i]));
          }
#endif /* SQLITE_OMIT_GENERATED_COLUMNS */
        }
      }else if( sParse.pNewIndex ){
        sqlite3WalkExprList(&sWalker, sParse.pNewIndex->aColExpr);
        sqlite3WalkExpr(&sWalker, sParse.pNewIndex->pPartIdxWhere);
      }else{
#ifndef SQLITE_OMIT_TRIGGER
        rc = renameResolveTrigger(&sParse);
        if( rc==SQLITE_OK ){
          renameWalkTrigger(&sWalker, sParse.pNewTrigger);
        }
#endif /* SQLITE_OMIT_TRIGGER */
      }

      if( rc==SQLITE_OK ){
        rc = renameEditSql(context, &sCtx, zInput, 0, 0);
      }
      renameTokenFree(db, sCtx.pList);
    }
    if( rc!=SQLITE_OK ){
      if( sqlite3WritableSchema(db) && rc==SQLITE_ERROR ){
        sqlite3_result_value(context, argv[1]);
      }else{
        sqlite3_result_error_code(context, rc);
      }
    }
    renameParseCleanup(&sParse);
  }

#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = xAuth;
#endif

  sqlite3BtreeLeaveAll(db);
}